

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffpunt(fitsfile *fptr,char *keyname,char *unit,int *status)

{
  int iVar1;
  size_t local_198;
  size_t len;
  char *loc;
  char card [81];
  char local_128 [8];
  char value [71];
  char local_d8 [8];
  char newcomm [73];
  char oldcomm [73];
  int *status_local;
  char *unit_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    iVar1 = ffgkey(fptr,keyname,local_128,newcomm + 0x48,status);
    if (iVar1 < 1) {
      if (*unit == '\0') {
        local_d8[0] = '\0';
        local_198 = 0x48;
      }
      else {
        strcpy(local_d8,"[");
        strncat(local_d8,unit,0x2d);
        strcat(local_d8,"] ");
        local_198 = strlen(local_d8);
        local_198 = 0x48 - local_198;
      }
      if (newcomm[0x48] == '[') {
        len = (size_t)strchr(newcomm + 0x48,0x5d);
        if ((char *)len == (char *)0x0) {
          strncat(local_d8,newcomm + 0x48,local_198);
        }
        else {
          do {
            len = len + 1;
          } while (*(char *)len == ' ');
          strncat(local_d8,(char *)len,local_198);
        }
      }
      else {
        strncat(local_d8,newcomm + 0x48,local_198);
      }
      ffmkky(keyname,local_128,local_d8,(char *)&loc,status);
      ffmkey(fptr,(char *)&loc,status);
      fptr_local._4_4_ = *status;
    }
    else {
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpunt(fitsfile *fptr,     /* I - FITS file pointer   */
           const char *keyname,/* I - keyword name        */
           const char *unit,   /* I - keyword unit string */
           int *status)        /* IO - error status       */
/*
    Write (put) the units string into the comment field of the existing keyword.
    This routine uses a  FITS convention  in which the units are enclosed in 
    square brackets following the '/' comment field delimiter, e.g.:

    KEYWORD =                   12 / [kpc] comment string goes here
*/
{
    char oldcomm[FLEN_COMMENT];
    char newcomm[FLEN_COMMENT];
    char value[FLEN_VALUE];
    char card[FLEN_CARD];
    char *loc;
    size_t len;
 
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, value, oldcomm, status) > 0)
        return(*status);

    /* copy the units string to the new comment string if not null */
    if (*unit)
    {
        strcpy(newcomm, "[");
        strncat(newcomm, unit, 45);  /* max allowed length is about 45 chars */
        strcat(newcomm, "] ");
        len = strlen(newcomm);  
        len = FLEN_COMMENT - len - 1;  /* amount of space left in the field */
    }
    else
    {
        newcomm[0] = '\0';
        len = FLEN_COMMENT - 1;
    }

    if (oldcomm[0] == '[')  /* check for existing units field */
    {
        loc = strchr(oldcomm, ']');  /* look for the closing bracket */
        if (loc)
        {
            loc++;
            while (*loc == ' ')   /* skip any blank spaces */
               loc++;

            strncat(newcomm, loc, len);  /* concat remainder of comment */
        }
        else
        {
            strncat(newcomm, oldcomm, len);  /* append old comment onto new */
        }
    }
    else
    {
        strncat(newcomm, oldcomm, len);
    }

    ffmkky(keyname, value, newcomm, card, status);  /* construct the card */
    ffmkey(fptr, card, status);  /* rewrite with new units string */

    return(*status);
}